

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_xfer_write_resp_hd(Curl_easy *data,char *hd0,size_t hdlen,_Bool is_eos)

{
  undefined1 *puVar1;
  _func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *p_Var2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  undefined8 in_R9;
  _func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = data->conn->handler->write_resp_hd;
  if (UNRECOVERED_JUMPTABLE == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0) {
    p_Var2 = data->conn->handler->write_resp;
    if (p_Var2 == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0) {
      CVar4 = CURLE_OK;
      if (hdlen != 0 || is_eos) {
        CVar4 = Curl_client_write(data,(uint)is_eos * 0x80 + 1,hd0,hdlen);
      }
    }
    else {
      CVar4 = (*p_Var2)(data,hd0,hdlen,is_eos);
    }
    if (is_eos && CVar4 == CURLE_OK) {
      puVar1 = &(data->req).field_0xd9;
      *puVar1 = *puVar1 | 0x18;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_write.log_level)))) {
      Curl_trc_write(data,"xfer_write_resp(len=%zu, eos=%d) -> %d",hdlen,(ulong)(uint)is_eos,
                     (ulong)CVar4,in_R9,UNRECOVERED_JUMPTABLE);
    }
    return CVar4;
  }
  CVar4 = (*UNRECOVERED_JUMPTABLE)(data,hd0,hdlen,is_eos);
  return CVar4;
}

Assistant:

CURLcode Curl_xfer_write_resp_hd(struct Curl_easy *data,
                                 const char *hd0, size_t hdlen, bool is_eos)
{
  if(data->conn->handler->write_resp_hd) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    return data->conn->handler->write_resp_hd(data, hd0, hdlen, is_eos);
  }
  /* No special handling by protocol handler, write as response bytes */
  return Curl_xfer_write_resp(data, hd0, hdlen, is_eos);
}